

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

size_t sysbvm_tuple_hash(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  ulong uVar1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_object_tuple_t *object;
  sysbvm_tuple_t local_20;
  
  uVar1 = tuple & 0xf;
  psVar2 = (sysbvm_tuple_t *)tuple;
  if (uVar1 != 0 || tuple == 0) {
    if ((int)uVar1 == 0xf) {
      if (0x5f < tuple) goto LAB_00139148;
      psVar2 = (context->roots).immediateTrivialTypeTable + (tuple >> 4);
    }
    else {
      psVar2 = (context->roots).immediateTypeTable + uVar1;
    }
  }
  if ((*psVar2 != 0) && (sVar3 = sysbvm_type_getHashFunction(context,*psVar2), sVar3 != 0)) {
    local_20 = tuple;
    sVar3 = sysbvm_function_apply(context,sVar3,1,&local_20,0);
    if (sVar3 == 0 || (sVar3 & 0xf) != 0) {
      return (long)sVar3 >> 4;
    }
    return *(size_t *)(sVar3 + 0x10);
  }
  if (uVar1 == 0 && tuple != 0) {
    return (ulong)(*(uint *)(tuple + 8) >> 10);
  }
LAB_00139148:
  return tuple * 0x41c64e6d & 0x7ffffffffffffff;
}

Assistant:

SYSBVM_API size_t sysbvm_tuple_hash(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, tuple);
    if(type)
    {
        sysbvm_tuple_t hashFunction = sysbvm_type_getHashFunction(context, type);
        if(hashFunction)
            return sysbvm_tuple_size_decode(sysbvm_function_apply1(context, hashFunction, tuple));
    }

    return sysbvm_tuple_identityHash(tuple);
}